

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

int __thiscall glcts::DrawIndirectTestsES31::init(DrawIndirectTestsES31 *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  glcts::(anonymous_namespace)::DILogger::s_tcuLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"basic-binding-default",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CDefaultBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-binding-zero",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CZeroBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-binding-single",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CSingleBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-binding-multi",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-binding-delete",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CDeleteBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-data",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferData<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-subData",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-getPointerv",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-mapRange",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-flushMappedRange",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-buffer-copySubData",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferCopySubData<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-singlePrimitive",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawArraysSingle<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-manyPrimitives",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawArraysMany<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-instancing",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawArraysInstancing<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-xfbPaused",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-singlePrimitive",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawElementsSingle<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-manyPrimitives",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawElementsMany<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-instancing",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawElementsInstancing<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-xfbPaused",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-simple",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-noFirst",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawArraysNoFirst<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-bufferOffset",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawArraysOffset<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawArrays-vertexIds",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawArraysVertexIds<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-simple",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsSimple<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-noFirstIndex",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-basevertex",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsNoBasevertex<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-bufferOffset",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsOffset<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-drawElements-vertexIds",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsVertexIds<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-indicesDataType-unsigned_short",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CIndicesDataTypeUnsignedShort<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-indicesDataType-unsigned_byte",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-points",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysPoints<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-lines",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysLines<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-line_strip",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysLineStrip<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-line_loop",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysLineLoop<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-triangle_strip",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysTriangleStrip<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-triangle_fan",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysTriangleFan<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawArrays-lines_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysLinesAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawArrays-line_strip_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysLineStripAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawArrays-triangles_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysTrianglesAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawArrays-triangle_strip_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawArraysTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-points",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsPoints<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-lines",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsLines<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-line_strip",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsLineStrip<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-line_loop",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsLineLoop<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-triangle_strip",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsTriangleStrip<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-triangle_fan",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsTriangleFan<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-mode-drawElements-lines_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsLinesAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawElements-line_strip_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsLineStripAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawElements-triangles_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsTrianglesAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "basic-mode-drawElements-triangle_strip_adjacency",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "advanced-twoPass-transformFeedback-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CTransformFeedbackArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "advanced-twoPass-transformFeedback-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CTransformFeedbackElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-twoPass-Compute-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CComputeShaderArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-twoPass-Compute-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CComputeShaderElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-primitiveRestart-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"misc-reservedMustBeZero-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNonZeroReservedMustBeZeroArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"misc-reservedMustBeZero-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNonZeroReservedMustBeZeroElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noindirect-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeZeroBufferArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noindirect-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeZeroBufferElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-invalidMode-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeInvalidModeArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-invalidMode-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noVAO-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noVAO-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeNoVAOElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noVBO-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeNoVBOArrays<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-noVBO-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeNoVBOElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-bufferMapped-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeBufferMappedArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-bufferMapped-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeBufferMappedElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-invalidType-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeDataWrongElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-wrongOffset-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeStructureWrongOffsetArray<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-wrongOffset-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeStructureWrongOffsetElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-invalidSize-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeInvalidSizeArrays<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-invalidSize-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-unalignedOffset",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-xfb",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawIndirectTestsES31::init()
{
	using namespace glcts;

	DILogger::setOutput(m_context.getTestContext().getLog());

	addChild(
		new TestSubcase(m_context, "basic-binding-default", TestSubcase::Create<CDefaultBindingPoint<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-binding-zero", TestSubcase::Create<CZeroBindingPoint<test_api::ES3> >));
	addChild(
		new TestSubcase(m_context, "basic-binding-single", TestSubcase::Create<CSingleBindingPoint<test_api::ES3> >));
	addChild(
		new TestSubcase(m_context, "basic-binding-multi", TestSubcase::Create<CMultiBindingPoint<test_api::ES3> >));
	addChild(
		new TestSubcase(m_context, "basic-binding-delete", TestSubcase::Create<CDeleteBindingPoint<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-buffer-data", TestSubcase::Create<CBufferData<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-buffer-subData", TestSubcase::Create<CBufferSubData<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-buffer-getPointerv",
							 TestSubcase::Create<CBufferGetPointerv<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-buffer-mapRange", TestSubcase::Create<CBufferMapRange<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-buffer-flushMappedRange",
							 TestSubcase::Create<CBufferFlushMappedRange<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-buffer-copySubData",
							 TestSubcase::Create<CBufferCopySubData<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-drawArrays-singlePrimitive",
							 TestSubcase::Create<CVBODrawArraysSingle<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-manyPrimitives",
							 TestSubcase::Create<CVBODrawArraysMany<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-instancing",
							 TestSubcase::Create<CVBODrawArraysInstancing<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-xfbPaused",
							 TestSubcase::Create<CVBODrawArraysXFBPaused<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-singlePrimitive",
							 TestSubcase::Create<CVBODrawElementsSingle<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-manyPrimitives",
							 TestSubcase::Create<CVBODrawElementsMany<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-instancing",
							 TestSubcase::Create<CVBODrawElementsInstancing<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-xfbPaused",
							 TestSubcase::Create<CVBODrawArraysXFBPaused<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-drawArrays-simple",
							 TestSubcase::Create<CBufferIndirectDrawArraysSimple<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-noFirst",
							 TestSubcase::Create<CBufferIndirectDrawArraysNoFirst<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-bufferOffset",
							 TestSubcase::Create<CBufferIndirectDrawArraysOffset<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawArrays-vertexIds",
							 TestSubcase::Create<CBufferIndirectDrawArraysVertexIds<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-simple",
							 TestSubcase::Create<CBufferIndirectDrawElementsSimple<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-noFirstIndex",
							 TestSubcase::Create<CBufferIndirectDrawElementsNoFirstIndex<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-basevertex",
							 TestSubcase::Create<CBufferIndirectDrawElementsNoBasevertex<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-bufferOffset",
							 TestSubcase::Create<CBufferIndirectDrawElementsOffset<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-drawElements-vertexIds",
							 TestSubcase::Create<CBufferIndirectDrawElementsVertexIds<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-indicesDataType-unsigned_short",
							 TestSubcase::Create<CIndicesDataTypeUnsignedShort<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-indicesDataType-unsigned_byte",
							 TestSubcase::Create<CIndicesDataTypeUnsignedByte<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-points",
							 TestSubcase::Create<CModeDrawArraysPoints<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-lines",
							 TestSubcase::Create<CModeDrawArraysLines<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-line_strip",
							 TestSubcase::Create<CModeDrawArraysLineStrip<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-line_loop",
							 TestSubcase::Create<CModeDrawArraysLineLoop<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-triangle_strip",
							 TestSubcase::Create<CModeDrawArraysTriangleStrip<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-triangle_fan",
							 TestSubcase::Create<CModeDrawArraysTriangleFan<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-lines_adjacency",
							 TestSubcase::Create<CModeDrawArraysLinesAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-line_strip_adjacency",
							 TestSubcase::Create<CModeDrawArraysLineStripAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-triangles_adjacency",
							 TestSubcase::Create<CModeDrawArraysTrianglesAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawArrays-triangle_strip_adjacency",
							 TestSubcase::Create<CModeDrawArraysTriangleStripAdjacency<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "basic-mode-drawElements-points",
							 TestSubcase::Create<CModeDrawElementsPoints<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-lines",
							 TestSubcase::Create<CModeDrawElementsLines<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-line_strip",
							 TestSubcase::Create<CModeDrawElementsLineStrip<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-line_loop",
							 TestSubcase::Create<CModeDrawElementsLineLoop<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-triangle_strip",
							 TestSubcase::Create<CModeDrawElementsTriangleStrip<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-triangle_fan",
							 TestSubcase::Create<CModeDrawElementsTriangleFan<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-lines_adjacency",
							 TestSubcase::Create<CModeDrawElementsLinesAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-line_strip_adjacency",
							 TestSubcase::Create<CModeDrawElementsLineStripAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-triangles_adjacency",
							 TestSubcase::Create<CModeDrawElementsTrianglesAdjacency<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "basic-mode-drawElements-triangle_strip_adjacency",
							 TestSubcase::Create<CModeDrawElementsTriangleStripAdjacency<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "advanced-twoPass-transformFeedback-arrays",
							 TestSubcase::Create<CTransformFeedbackArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "advanced-twoPass-transformFeedback-elements",
							 TestSubcase::Create<CTransformFeedbackElements<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "advanced-twoPass-Compute-arrays",
							 TestSubcase::Create<CComputeShaderArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "advanced-twoPass-Compute-elements",
							 TestSubcase::Create<CComputeShaderElements<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "advanced-primitiveRestart-elements",
							 TestSubcase::Create<CPrimitiveRestartElements<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "misc-reservedMustBeZero-arrays",
							 TestSubcase::Create<CNonZeroReservedMustBeZeroArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "misc-reservedMustBeZero-elements",
							 TestSubcase::Create<CNonZeroReservedMustBeZeroElements<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "negative-noindirect-arrays",
							 TestSubcase::Create<CNegativeZeroBufferArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-noindirect-elements",
							 TestSubcase::Create<CNegativeZeroBufferElements<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-invalidMode-arrays",
							 TestSubcase::Create<CNegativeInvalidModeArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-invalidMode-elements",
							 TestSubcase::Create<CNegativeInvalidModeElements<test_api::ES3> >));
	addChild(
		new TestSubcase(m_context, "negative-noVAO-arrays", TestSubcase::Create<CNegativeNoVAOArrays<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-noVAO-elements",
							 TestSubcase::Create<CNegativeNoVAOElements<test_api::ES3> >));
	addChild(
		new TestSubcase(m_context, "negative-noVBO-arrays", TestSubcase::Create<CNegativeNoVBOArrays<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-noVBO-elements",
							 TestSubcase::Create<CNegativeNoVBOElements<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-bufferMapped-arrays",
							 TestSubcase::Create<CNegativeBufferMappedArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-bufferMapped-elements",
							 TestSubcase::Create<CNegativeBufferMappedElements<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-invalidType-elements",
							 TestSubcase::Create<CNegativeDataWrongElements<test_api::ES3> >));

	addChild(new TestSubcase(m_context, "negative-wrongOffset-arrays",
							 TestSubcase::Create<CNegativeStructureWrongOffsetArray<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-wrongOffset-elements",
							 TestSubcase::Create<CNegativeStructureWrongOffsetElements<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-invalidSize-arrays",
							 TestSubcase::Create<CNegativeInvalidSizeArrays<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-invalidSize-elements",
							 TestSubcase::Create<CNegativeInvalidSizeElements<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-unalignedOffset",
							 TestSubcase::Create<CNegativeUnalignedOffset<test_api::ES3> >));
	addChild(new TestSubcase(m_context, "negative-xfb", TestSubcase::Create<CNegativeXFB<test_api::ES3> >));
}